

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::mousePressEvent(QGraphicsItem *this,QGraphicsSceneMouseEvent *event)

{
  bool bVar1;
  byte bVar2;
  MouseButton MVar3;
  Int IVar4;
  Int IVar5;
  QFlagsStorage<Qt::WindowType> lhs;
  QGraphicsScenePrivate *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  uint uVar8;
  socklen_t *__addr_len;
  sockaddr *__addr;
  int iVar9;
  QEvent *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar10;
  QGraphicsWidget *w;
  QGraphicsScene *scene;
  bool multiSelect;
  KeyboardModifier in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff78;
  QGraphicsScene *in_stack_ffffffffffffff80;
  QGraphicsWidget *this_00;
  QGraphicsWidget *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  QPointF local_58;
  undefined1 local_48 [36];
  QFlagsStorageHelper<Qt::WindowType,_4> local_24;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_20;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_1c;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_18;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_14;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_10;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MVar3 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)in_RDI);
  __addr_len = (socklen_t *)(ulong)MVar3;
  in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 & 0xffffff;
  if (MVar3 == LeftButton) {
    local_10.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)flags((QGraphicsItem *)in_RDI);
    local_c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_RDI,in_stack_ffffffffffffff6c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    in_stack_ffffffffffffff78 = CONCAT13(IVar4 != 0,(int3)in_stack_ffffffffffffff78);
  }
  if ((char)(in_stack_ffffffffffffff78 >> 0x18) == '\0') {
    local_20.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)flags((QGraphicsItem *)in_RDI);
    local_1c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_RDI,in_stack_ffffffffffffff6c);
    bVar1 = QFlags<QGraphicsItem::GraphicsItemFlag>::operator!
                      ((QFlags<QGraphicsItem::GraphicsItemFlag> *)&local_1c);
    if (bVar1) {
      QEvent::ignore(in_RSI);
    }
  }
  else {
    local_18.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QGraphicsSceneMouseEvent::modifiers((QGraphicsSceneMouseEvent *)in_RDI);
    local_14.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)in_RDI,in_stack_ffffffffffffff6c);
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    uVar10 = IVar5 != 0;
    if ((!(bool)uVar10) &&
       (pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&(in_RDI->super_QGraphicsObject).field_0x8),
       (*(ulong *)&pQVar7->field_0x160 >> 9 & 1) == 0)) {
      pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_RDI->super_QGraphicsObject).field_0x8);
      in_stack_ffffffffffffff88 = (QGraphicsWidget *)pQVar7->scene;
      if (in_stack_ffffffffffffff88 != (QGraphicsWidget *)0x0) {
        pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0x985631);
        pQVar6->selectionChanging = pQVar6->selectionChanging + 1;
        QGraphicsScene::clearSelection(in_stack_ffffffffffffff80);
        pQVar6 = QGraphicsScene::d_func((QGraphicsScene *)0x985654);
        uVar8 = pQVar6->selectionChanging - 1;
        __addr_len = (socklen_t *)(ulong)uVar8;
        pQVar6->selectionChanging = uVar8;
      }
      setSelected((QGraphicsItem *)CONCAT17(uVar10,in_stack_ffffffffffffff90),
                  SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
    }
  }
  pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&(in_RDI->super_QGraphicsObject).field_0x8);
  if ((*(ulong *)&pQVar7->field_0x160 >> 0x18 & 1) != 0) {
    this_00 = (QGraphicsWidget *)&in_RDI[-1].super_QGraphicsLayoutItem;
    local_24.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)QGraphicsWidget::windowFlags(in_RDI);
    lhs.i = (Int)QFlags<Qt::WindowType>::operator&
                           ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffff6c);
    iVar9 = 9;
    bVar1 = ::operator==((QFlags<Qt::WindowType>)lhs.i,(WindowType)in_RDI);
    if (bVar1) {
      QEvent::accept(in_RSI,iVar9,__addr,__addr_len);
      QGraphicsWidget::rect(in_stack_ffffffffffffff88);
      local_58 = QGraphicsSceneMouseEvent::pos
                           ((QGraphicsSceneMouseEvent *)CONCAT44(lhs.i,in_stack_ffffffffffffff78));
      iVar9 = (int)&local_58;
      bVar2 = QRectF::contains((QPointF *)local_48);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        QGraphicsWidget::close(this_00,iVar9);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::mousePressEvent(QGraphicsSceneMouseEvent *event)
{
    if (event->button() == Qt::LeftButton && (flags() & ItemIsSelectable)) {
        bool multiSelect = (event->modifiers() & Qt::ControlModifier) != 0;
        if (!multiSelect) {
            if (!d_ptr->selected) {
                if (QGraphicsScene *scene = d_ptr->scene) {
                    ++scene->d_func()->selectionChanging;
                    scene->clearSelection();
                    --scene->d_func()->selectionChanging;
                }
                setSelected(true);
            }
        }
    } else if (!(flags() & ItemIsMovable)) {
        event->ignore();
    }
    if (d_ptr->isWidget) {
        // Qt::Popup closes when you click outside.
        QGraphicsWidget *w = static_cast<QGraphicsWidget *>(this);
        if ((w->windowFlags() & Qt::Popup) == Qt::Popup) {
            event->accept();
            if (!w->rect().contains(event->pos()))
                w->close();
        }
    }
}